

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absVta.c
# Opt level: O3

int Gia_VtaPerformInt(Gia_Man_t *pAig,Abs_Par_t *pPars)

{
  byte bVar1;
  uint uVar2;
  Vec_Set_t *pVVar3;
  uint *__dest;
  int **ppiVar4;
  Vec_Ptr_t *pVVar5;
  ABC_INT64_T AVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  Vec_Int_t *pVVar12;
  int *piVar13;
  Vta_Man_t *p;
  Abc_Cex_t *pAVar14;
  sat_solver2 *psVar15;
  void **ppvVar16;
  Abc_Frame_t *pAbc;
  Abs_Par_t *pAVar17;
  abctime aVar18;
  ulong uVar19;
  long lVar20;
  long lVar21;
  ulong uVar22;
  double dVar23;
  long lVar24;
  Gia_Man_t *pGVar25;
  char *pcVar26;
  Vta_Man_t *pVVar27;
  Vec_Vec_t *vFrames;
  long lVar28;
  double dVar29;
  int Status;
  int nConfls;
  timespec ts;
  int local_454;
  double local_450;
  int local_444;
  Vec_Int_t *local_440;
  Gia_Man_t *local_438;
  int local_42c;
  int local_428;
  int local_424;
  long local_420;
  timespec local_418 [62];
  
  iVar7 = clock_gettime(3,local_418);
  if (iVar7 < 0) {
    lVar28 = -1;
  }
  else {
    lVar28 = local_418[0].tv_nsec / 1000 + local_418[0].tv_sec * 1000000;
  }
  iVar7 = pAig->nRegs;
  iVar10 = pAig->vCos->nSize;
  if (iVar10 - iVar7 != 1) {
    __assert_fail("Gia_ManPoNum(pAig) == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absVta.c"
                  ,0x5dc,"int Gia_VtaPerformInt(Gia_Man_t *, Abs_Par_t *)");
  }
  if ((pPars->nFramesMax != 0) && (pPars->nFramesMax < pPars->nFramesStart)) {
    __assert_fail("pPars->nFramesMax == 0 || pPars->nFramesStart <= pPars->nFramesMax",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absVta.c"
                  ,0x5dd,"int Gia_VtaPerformInt(Gia_Man_t *, Abs_Par_t *)");
  }
  if (iVar10 <= iVar7) {
LAB_00629095:
    __assert_fail("v < Gia_ManPoNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                  ,0x1d5,"Gia_Obj_t *Gia_ManPo(Gia_Man_t *, int)");
  }
  if (iVar10 < 1) {
LAB_006290b4:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                  ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
  iVar10 = *pAig->vCos->pArray;
  if (((long)iVar10 < 0) || (pAig->nObjs <= iVar10)) {
LAB_00629076:
    __assert_fail("v >= 0 && v < p->nObjs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                  ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
  }
  uVar8 = (uint)*(undefined8 *)(pAig->pObjs + iVar10);
  if ((~*(ulong *)(pAig->pObjs + iVar10 + -(ulong)(uVar8 & 0x1fffffff)) & 0x1fffffff1fffffff) == 0)
  {
    if ((uVar8 >> 0x1d & 1) == 0) {
      puts("Sequential miter is trivially UNSAT.");
      iVar10 = 1;
    }
    else {
      if (pAig->pCexSeq != (Abc_Cex_t *)0x0) {
        free(pAig->pCexSeq);
        pAig->pCexSeq = (Abc_Cex_t *)0x0;
        iVar7 = pAig->nRegs;
      }
      iVar10 = 0;
      pAVar14 = Abc_CexMakeTriv(iVar7,pAig->vCis->nSize - iVar7,1,0);
      pAig->pCexSeq = pAVar14;
      puts("Sequential miter is trivially SAT.");
    }
    return iVar10;
  }
  if (pAig->vObjClasses == (Vec_Int_t *)0x0) {
    pVVar12 = (Vec_Int_t *)malloc(0x10);
    pVVar12->nCap = 0x10;
    pVVar12->nSize = 0;
    piVar13 = (int *)malloc(0x40);
    pVVar12->pArray = piVar13;
    pAig->vObjClasses = pVVar12;
    Vec_IntPush(pVVar12,1);
    Vec_IntPush(pAig->vObjClasses,3);
    Vec_IntPush(pAig->vObjClasses,4);
    iVar7 = pAig->vCos->nSize;
    if (iVar7 <= pAig->nRegs) goto LAB_00629095;
    if (iVar7 < 1) goto LAB_006290b4;
    iVar7 = *pAig->vCos->pArray;
    if (((long)iVar7 < 0) || (pAig->nObjs <= iVar7)) goto LAB_00629076;
    Vec_IntPush(pAig->vObjClasses,iVar7 - (*(uint *)(pAig->pObjs + iVar7) & 0x1fffffff));
  }
  pGVar25 = pAig;
  p = Vga_ManStart(pAig,pPars);
  iVar10 = (int)pGVar25;
  pAVar17 = p->pPars;
  iVar7 = pAVar17->nTimeOut;
  if ((long)iVar7 != 0) {
    psVar15 = p->pSat;
    iVar10 = 3;
    iVar9 = clock_gettime(3,local_418);
    if (iVar9 < 0) {
      lVar20 = -1;
    }
    else {
      lVar20 = local_418[0].tv_nsec / 1000 + local_418[0].tv_sec * 1000000;
    }
    psVar15->nRuntimeLimit = lVar20 + (long)iVar7 * 1000000;
    pAVar17 = p->pPars;
  }
  if (pAVar17->fVerbose != 0) {
    Abc_Print(iVar10,"Running variable-timeframe abstraction (VTA) with the following parameters:\n"
             );
    Abc_Print(iVar10,"FramePast = %d  FrameMax = %d  ConfMax = %d  Timeout = %d  RatioMin = %d %%\n"
              ,(ulong)(uint)pPars->nFramesPast,(ulong)(uint)pPars->nFramesMax,
              (ulong)(uint)pPars->nConfLimit,(ulong)(uint)pPars->nTimeOut,pPars->nRatioMin);
    Abc_Print(iVar10,"LearnStart = %d  LearnDelta = %d  LearnRatio = %d %%.\n",
              (ulong)(uint)pPars->nLearnedStart,(ulong)(uint)pPars->nLearnedDelta,
              (ulong)(uint)pPars->nLearnedPerce);
    Abc_Print(iVar10,
              " Frame   %%   Abs   %%   Confl  Cex   Vars   Clas   Lrns   Core     Time      Mem\n")
    ;
  }
  if (p->vFrames->nSize < 1) {
    __assert_fail("Vec_PtrSize(p->vFrames) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absVta.c"
                  ,0x604,"int Gia_VtaPerformInt(Gia_Man_t *, Abs_Par_t *)");
  }
  pAVar17 = p->pPars;
  if (-1 < pAVar17->nFramesMax) {
    local_420 = -1;
    local_42c = 0;
    local_444 = 0;
    dVar29 = 0.0;
    local_438 = pAig;
LAB_00627dc6:
    psVar15 = p->pSat;
    local_428 = (int)(psVar15->stats).conflicts;
    iVar7 = SUB84(dVar29,0);
    pAVar17->iFrame = iVar7;
    if (dVar29 == (double)(ulong)(uint)(p->nWords << 5)) {
      iVar10 = Vec_IntDoubleWidth(p->vSeens,p->nWords);
      p->nWords = iVar10;
      psVar15 = p->pSat;
    }
    if (psVar15->qhead != psVar15->qtail) {
      __assert_fail("s->qhead == s->qtail",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver2.h"
                    ,0xfa,"void sat_solver2_bookmark(sat_solver2 *)");
    }
    local_440 = (Vec_Int_t *)CONCAT44(local_440._4_4_,p->nObjs);
    iVar10 = psVar15->size;
    psVar15->iVarPivot = iVar10;
    psVar15->iTrailPivot = psVar15->qhead;
    pVVar3 = psVar15->pPrf1;
    if (pVVar3 != (Vec_Set_t *)0x0) {
      psVar15->hProofPivot =
           (pVVar3->iPage << ((byte)pVVar3->nPageSize & 0x1f)) + (int)*pVVar3->pPages[pVVar3->iPage]
      ;
    }
    __dest = psVar15->activity2;
    *(undefined8 *)(psVar15->Mem).BookMarkE = *(undefined8 *)(psVar15->Mem).nEntries;
    iVar9 = (psVar15->Mem).iPage[0];
    bVar1 = (byte)(psVar15->Mem).nPageSize;
    ppiVar4 = (psVar15->Mem).pPages;
    (psVar15->Mem).BookMarkH[0] = iVar9 << (bVar1 & 0x1f) | *ppiVar4[iVar9];
    iVar9 = (psVar15->Mem).iPage[1];
    (psVar15->Mem).BookMarkH[1] = iVar9 << (bVar1 & 0x1f) | *ppiVar4[iVar9];
    if (__dest != (uint *)0x0) {
      psVar15->var_inc2 = psVar15->var_inc;
      memcpy(__dest,psVar15->activity,(long)iVar10 << 2);
    }
    p->vAddedNew->nSize = 0;
    Vga_ManAddClausesOne(p,0,iVar7);
    if ((long)dVar29 < (long)p->vFrames->nSize) {
      Vga_ManLoadSlice(p,(Vec_Int_t *)p->vFrames->pArray[(long)dVar29],0);
    }
    else {
      iVar10 = p->pPars->nFramesPast;
      if (iVar7 <= iVar10) {
        iVar10 = iVar7;
      }
      if (0 < iVar10) {
        dVar23 = 0.0;
        lVar20 = local_420;
        do {
          if ((dVar29 == dVar23) || (p->vCores->nSize <= lVar20)) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                          ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
          }
          dVar23 = (double)((long)dVar23 + 1);
          Vga_ManLoadSlice(p,(Vec_Int_t *)p->vCores->pArray[lVar20],SUB84(dVar23,0));
          iVar10 = p->pPars->nFramesPast;
          if (iVar7 <= iVar10) {
            iVar10 = iVar7;
          }
          lVar20 = lVar20 + -1;
        } while ((long)dVar23 < (long)iVar10);
      }
    }
    local_450 = (double)((long)dVar29 + 1);
    iVar9 = 0;
    do {
      iVar10 = clock_gettime(3,local_418);
      if (iVar10 < 0) {
        lVar20 = 1;
      }
      else {
        lVar20 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_418[0].tv_nsec),8);
        lVar20 = ((lVar20 >> 7) - (lVar20 >> 0x3f)) + local_418[0].tv_sec * -1000000;
      }
      iVar10 = Vga_ManGetOutLit(p,iVar7);
      pVVar12 = Vta_ManUnsatCore(iVar10,p->pSat,pPars->nConfLimit,(int)pPars,&local_454,&local_424);
      if ((local_454 != 1) == (pVVar12 != (Vec_Int_t *)0x0)) {
        __assert_fail("(vCore != NULL) == (Status == 1)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absVta.c"
                      ,0x621,"int Gia_VtaPerformInt(Gia_Man_t *, Abs_Par_t *)");
      }
      if (local_454 == -1) {
LAB_0062861e:
        pVVar27 = p;
        Vga_ManRollBack(p,(int)local_440);
        iVar10 = (int)pVVar27;
        goto LAB_00628630;
      }
      if (p->pSat->nRuntimeLimit != 0) {
        iVar10 = clock_gettime(3,local_418);
        if (iVar10 < 0) {
          lVar21 = -1;
        }
        else {
          lVar21 = local_418[0].tv_nsec / 1000 + local_418[0].tv_sec * 1000000;
        }
        if (p->pSat->nRuntimeLimit < lVar21) goto LAB_0062861e;
      }
      if (pVVar12 != (Vec_Int_t *)0x0) goto LAB_006281e3;
      iVar10 = clock_gettime(3,local_418);
      if (iVar10 < 0) {
        lVar21 = -1;
      }
      else {
        lVar21 = local_418[0].tv_nsec / 1000 + local_418[0].tv_sec * 1000000;
      }
      p->timeSat = p->timeSat + lVar21 + lVar20;
      if (local_454 != 0) {
        __assert_fail("Status == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absVta.c"
                      ,0x633,"int Gia_VtaPerformInt(Gia_Man_t *, Abs_Par_t *)");
      }
      p->nCexes = p->nCexes + 1;
      iVar10 = clock_gettime(3,local_418);
      if (iVar10 < 0) {
        lVar20 = 1;
      }
      else {
        lVar20 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_418[0].tv_nsec),8);
        lVar20 = ((lVar20 >> 7) - (lVar20 >> 0x3f)) + local_418[0].tv_sec * -1000000;
      }
      pAVar14 = Vta_ManRefineAbstraction(p,iVar7);
      iVar10 = clock_gettime(3,local_418);
      if (iVar10 < 0) {
        lVar21 = -1;
      }
      else {
        lVar21 = local_418[0].tv_nsec / 1000 + local_418[0].tv_sec * 1000000;
      }
      p->timeCex = p->timeCex + lVar21 + lVar20;
      if (pAVar14 != (Abc_Cex_t *)0x0) {
        pAVar17 = p->pPars;
        pAig = local_438;
        goto LAB_00628715;
      }
      AVar6 = (p->pSat->stats).conflicts;
      iVar10 = clock_gettime(3,local_418);
      if (iVar10 < 0) {
        lVar20 = -1;
      }
      else {
        lVar20 = local_418[0].tv_nsec / 1000 + local_418[0].tv_sec * 1000000;
      }
      Vta_ManAbsPrintFrame
                (p,(Vec_Int_t *)0x0,SUB84(local_450,0),(int)AVar6 - local_428,iVar9,lVar20 - lVar28,
                 p->pPars->fVerbose);
      iVar9 = iVar9 + 1;
    } while( true );
  }
  dVar29 = 0.0;
LAB_0062863e:
  pAVar17 = p->pPars;
  dVar29 = (double)((ulong)dVar29 & 0xffffffff);
LAB_00628645:
  if ((pAVar17->fVerbose != 0) && (local_454 == -1)) {
    iVar10 = 10;
    putchar(10);
  }
  iVar7 = p->vCores->nSize;
  if (iVar7 == 0) {
    Abc_Print(iVar10,"Abstraction is not produced because first frame is not solved.  ");
    goto LAB_006288a8;
  }
  if (iVar7 < 1) {
    __assert_fail("Vec_PtrSize(p->vCores) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absVta.c"
                  ,0x68e,"int Gia_VtaPerformInt(Gia_Man_t *, Abs_Par_t *)");
  }
  pVVar12 = pAig->vObjClasses;
  if (pVVar12 != (Vec_Int_t *)0x0) {
    if (pVVar12->pArray != (int *)0x0) {
      free(pVVar12->pArray);
      pAig->vObjClasses->pArray = (int *)0x0;
      pVVar12 = pAig->vObjClasses;
      if (pVVar12 == (Vec_Int_t *)0x0) goto LAB_006286b8;
    }
    free(pVVar12);
    pAig->vObjClasses = (Vec_Int_t *)0x0;
  }
LAB_006286b8:
  vFrames = (Vec_Vec_t *)p->vCores;
  pVVar12 = Gia_VtaFramesToAbs(vFrames);
  iVar7 = (int)vFrames;
  pAig->vObjClasses = pVVar12;
  pAVar17 = p->pPars;
  if (local_454 == -1) {
    if ((pAVar17->nTimeOut == 0) || (aVar18 = Abc_Clock(), aVar18 < p->pSat->nRuntimeLimit)) {
      uVar8 = pPars->nConfLimit;
      if ((uVar8 == 0) || ((int)(p->pSat->stats).conflicts < (int)uVar8)) {
        iVar10 = pAig->vCis->nSize;
        uVar22 = (ulong)(uint)pPars->nRatioMin;
        if (p->nSeenGla <
            ((100 - pPars->nRatioMin) * (iVar10 + pAig->nObjs + ~(pAig->vCos->nSize + iVar10))) /
            100) {
          Abc_Print(iVar7,"Abstraction stopped for unknown reason in frame %d.  ",
                    (ulong)dVar29 & 0xffffffff);
          goto LAB_006288a8;
        }
        pcVar26 = "The ratio of abstracted objects is less than %d %% in frame %d.  ";
        uVar19 = (ulong)dVar29 & 0xffffffff;
        goto LAB_006286ea;
      }
      uVar2 = p->pPars->nFramesNoChange;
      pcVar26 = "Exceeded %d conflicts in frame %d with a %d-stable abstraction.  ";
    }
    else {
      uVar8 = p->pPars->nTimeOut;
      uVar2 = p->pPars->nFramesNoChange;
      pcVar26 = "Timeout %d sec in frame %d with a %d-stable abstraction.    ";
    }
    Abc_Print(iVar7,pcVar26,(ulong)uVar8,(ulong)dVar29 & 0xffffffff,(ulong)uVar2);
  }
  else {
    pAVar17->iFrame = pAVar17->iFrame + 1;
    uVar19 = (ulong)(uint)pAVar17->nFramesNoChange;
    pcVar26 = "VTA completed %d frames with a %d-stable abstraction.  ";
    uVar22 = (ulong)dVar29 & 0xffffffff;
LAB_006286ea:
    Abc_Print(iVar7,pcVar26,uVar22,uVar19);
  }
LAB_006288a8:
  iVar10 = 3;
  iVar7 = clock_gettime(3,local_418);
  if (iVar7 < 0) {
    lVar20 = -1;
  }
  else {
    lVar20 = local_418[0].tv_nsec / 1000 + local_418[0].tv_sec * 1000000;
  }
  Abc_Print(iVar10,"%s =","Time");
  Abc_Print(iVar10,"%9.2f sec\n",(double)(lVar20 - lVar28) / 1000000.0);
  if (p->pPars->fVerbose != 0) {
    iVar10 = 3;
    iVar7 = clock_gettime(3,local_418);
    lVar21 = -1;
    lVar20 = -1;
    if (-1 < iVar7) {
      lVar20 = local_418[0].tv_nsec / 1000 + local_418[0].tv_sec * 1000000;
    }
    p->timeOther = lVar20 - (p->timeUnsat + lVar28 + p->timeSat + p->timeCex);
    Abc_Print(iVar10,"%s =","Runtime: Solver UNSAT");
    lVar20 = p->timeUnsat;
    iVar10 = 3;
    iVar7 = clock_gettime(3,local_418);
    if (-1 < iVar7) {
      lVar21 = local_418[0].tv_nsec / 1000 + local_418[0].tv_sec * 1000000;
    }
    dVar29 = 0.0;
    if (lVar21 != lVar28) {
      local_450 = (double)p->timeUnsat * 100.0;
      iVar10 = 3;
      iVar7 = clock_gettime(3,local_418);
      if (iVar7 < 0) {
        lVar21 = -1;
      }
      else {
        lVar21 = local_418[0].tv_nsec / 1000 + local_418[0].tv_sec * 1000000;
      }
      dVar29 = local_450 / (double)(lVar21 - lVar28);
    }
    Abc_Print(iVar10,"%9.2f sec (%6.2f %%)\n",(double)lVar20 / 1000000.0,dVar29);
    Abc_Print(iVar10,"%s =","Runtime: Solver SAT  ");
    lVar20 = p->timeSat;
    iVar10 = 3;
    iVar7 = clock_gettime(3,local_418);
    if (iVar7 < 0) {
      lVar21 = -1;
    }
    else {
      lVar21 = local_418[0].tv_nsec / 1000 + local_418[0].tv_sec * 1000000;
    }
    dVar29 = 0.0;
    if (lVar21 != lVar28) {
      local_450 = (double)p->timeSat * 100.0;
      iVar10 = 3;
      iVar7 = clock_gettime(3,local_418);
      if (iVar7 < 0) {
        lVar21 = -1;
      }
      else {
        lVar21 = local_418[0].tv_nsec / 1000 + local_418[0].tv_sec * 1000000;
      }
      dVar29 = local_450 / (double)(lVar21 - lVar28);
    }
    Abc_Print(iVar10,"%9.2f sec (%6.2f %%)\n",(double)lVar20 / 1000000.0,dVar29);
    Abc_Print(iVar10,"%s =","Runtime: Refinement  ");
    lVar20 = p->timeCex;
    iVar10 = 3;
    iVar7 = clock_gettime(3,local_418);
    if (iVar7 < 0) {
      lVar21 = -1;
    }
    else {
      lVar21 = local_418[0].tv_nsec / 1000 + local_418[0].tv_sec * 1000000;
    }
    dVar29 = 0.0;
    if (lVar21 != lVar28) {
      local_450 = (double)p->timeCex * 100.0;
      iVar10 = 3;
      iVar7 = clock_gettime(3,local_418);
      if (iVar7 < 0) {
        lVar21 = -1;
      }
      else {
        lVar21 = local_418[0].tv_nsec / 1000 + local_418[0].tv_sec * 1000000;
      }
      dVar29 = local_450 / (double)(lVar21 - lVar28);
    }
    Abc_Print(iVar10,"%9.2f sec (%6.2f %%)\n",(double)lVar20 / 1000000.0,dVar29);
    Abc_Print(iVar10,"%s =","Runtime: Other       ");
    lVar20 = p->timeOther;
    iVar10 = 3;
    iVar7 = clock_gettime(3,local_418);
    if (iVar7 < 0) {
      lVar21 = -1;
    }
    else {
      lVar21 = local_418[0].tv_nsec / 1000 + local_418[0].tv_sec * 1000000;
    }
    dVar29 = 0.0;
    if (lVar21 != lVar28) {
      local_450 = (double)p->timeOther * 100.0;
      iVar10 = 3;
      iVar7 = clock_gettime(3,local_418);
      if (iVar7 < 0) {
        lVar21 = -1;
      }
      else {
        lVar21 = local_418[0].tv_nsec / 1000 + local_418[0].tv_sec * 1000000;
      }
      dVar29 = local_450 / (double)(lVar21 - lVar28);
    }
    Abc_Print(iVar10,"%9.2f sec (%6.2f %%)\n",(double)lVar20 / 1000000.0,dVar29);
    Abc_Print(iVar10,"%s =","Runtime: TOTAL       ");
    iVar7 = clock_gettime(3,local_418);
    lVar21 = -1;
    lVar20 = -1;
    if (-1 < iVar7) {
      lVar20 = local_418[0].tv_nsec / 1000 + local_418[0].tv_sec * 1000000;
    }
    iVar10 = 3;
    iVar7 = clock_gettime(3,local_418);
    if (-1 < iVar7) {
      lVar21 = local_418[0].tv_nsec / 1000 + local_418[0].tv_sec * 1000000;
    }
    dVar29 = 0.0;
    if (lVar21 != lVar28) {
      iVar7 = clock_gettime(3,local_418);
      lVar24 = -1;
      lVar21 = -1;
      if (-1 < iVar7) {
        lVar21 = local_418[0].tv_nsec / 1000 + local_418[0].tv_sec * 1000000;
      }
      local_450 = (double)(lVar21 - lVar28) * 100.0;
      iVar10 = 3;
      iVar7 = clock_gettime(3,local_418);
      if (-1 < iVar7) {
        lVar24 = local_418[0].tv_nsec / 1000 + local_418[0].tv_sec * 1000000;
      }
      dVar29 = local_450 / (double)(lVar24 - lVar28);
    }
    Abc_Print(iVar10,"%9.2f sec (%6.2f %%)\n",(double)(lVar20 - lVar28) / 1000000.0,dVar29);
    Gia_VtaPrintMemory(p);
  }
  Vga_ManStop(p);
  fflush(_stdout);
LAB_006281e3:
  iVar10 = clock_gettime(3,local_418);
  if (iVar10 < 0) {
    lVar21 = -1;
  }
  else {
    lVar21 = local_418[0].tv_nsec / 1000 + local_418[0].tv_sec * 1000000;
  }
  p->timeUnsat = p->timeUnsat + lVar21 + lVar20;
  if (local_454 != 1) {
    __assert_fail("Status == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absVta.c"
                  ,0x63e,"int Gia_VtaPerformInt(Gia_Man_t *, Abs_Par_t *)");
  }
  Vta_ManUnsatCoreRemap(p,pVVar12);
  qsort(pVVar12->pArray,(long)pVVar12->nSize,4,Vec_IntSortCompare2);
  sat_solver2_rollback(p->pSat);
  Vga_ManRollBack(p,(int)local_440);
  Vga_ManLoadSlice(p,pVVar12,0);
  if (pVVar12->pArray != (int *)0x0) {
    free(pVVar12->pArray);
  }
  free(pVVar12);
  iVar10 = clock_gettime(3,local_418);
  if (iVar10 < 0) {
    lVar20 = 1;
  }
  else {
    lVar20 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_418[0].tv_nsec),8);
    lVar20 = ((lVar20 >> 7) - (lVar20 >> 0x3f)) + local_418[0].tv_sec * -1000000;
  }
  iVar10 = Vga_ManGetOutLit(p,iVar7);
  local_440 = Vta_ManUnsatCore(iVar10,p->pSat,pPars->nConfLimit,(int)pPars,&local_454,&local_424);
  iVar10 = 3;
  iVar11 = clock_gettime(3,local_418);
  pVVar12 = local_440;
  if (iVar11 < 0) {
    lVar21 = -1;
  }
  else {
    lVar21 = local_418[0].tv_nsec / 1000 + local_418[0].tv_sec * 1000000;
  }
  p->timeUnsat = p->timeUnsat + lVar21 + lVar20;
  if ((local_454 != 1) == (local_440 != (Vec_Int_t *)0x0)) {
    __assert_fail("(vCore != NULL) == (Status == 1)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absVta.c"
                  ,0x64e,"int Gia_VtaPerformInt(Gia_Man_t *, Abs_Par_t *)");
  }
  if (local_454 == -1) {
LAB_00628630:
    dVar29 = (double)((ulong)dVar29 & 0xffffffff);
    pAig = local_438;
    goto LAB_0062863e;
  }
  if (local_454 == 0) {
    Vta_ManSatVerify(p);
    pAig = local_438;
    if ((local_438->vObjClasses != (Vec_Int_t *)0x0) || (p->pPars->nFramesStart <= iVar7)) {
      __assert_fail("pAig->vObjClasses == NULL && f < p->pPars->nFramesStart",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absVta.c"
                    ,0x655,"int Gia_VtaPerformInt(Gia_Man_t *, Abs_Par_t *)");
    }
    pVVar27 = p;
    pAVar14 = Vga_ManDeriveCex(p);
    iVar10 = (int)pVVar27;
    pAVar17 = p->pPars;
    if (pAVar14 == (Abc_Cex_t *)0x0) goto LAB_00628645;
LAB_00628715:
    if (pAVar17->fVerbose != 0) {
      putchar(10);
    }
    pGVar25 = p->pGia;
    if (pGVar25->pCexSeq != (Abc_Cex_t *)0x0) {
      free(pGVar25->pCexSeq);
      pGVar25 = p->pGia;
      pGVar25->pCexSeq = (Abc_Cex_t *)0x0;
    }
    pGVar25->pCexSeq = pAVar14;
    iVar7 = Gia_ManVerifyCex(pGVar25,pAVar14,0);
    iVar10 = (int)pGVar25;
    if (iVar7 == 0) {
      Abc_Print(iVar10,"    Gia_VtaPerform(): CEX verification has failed!\n");
    }
    Abc_Print(iVar10,"Counter-example detected in frame %d.  ",(ulong)dVar29 & 0xffffffff);
    p->pPars->iFrame = pAVar14->iFrame + -1;
    pVVar12 = pAig->vObjClasses;
    if (pVVar12 == (Vec_Int_t *)0x0) goto LAB_006288a8;
    if (pVVar12->pArray != (int *)0x0) {
      free(pVVar12->pArray);
      pAig->vObjClasses->pArray = (int *)0x0;
      pVVar12 = pAig->vObjClasses;
      if (pVVar12 == (Vec_Int_t *)0x0) goto LAB_006288a8;
    }
    free(pVVar12);
    pAig->vObjClasses = (Vec_Int_t *)0x0;
    goto LAB_006288a8;
  }
  Vta_ManUnsatCoreRemap(p,local_440);
  qsort(pVVar12->pArray,(long)pVVar12->nSize,4,Vec_IntSortCompare2);
  pVVar5 = p->vCores;
  uVar8 = pVVar5->nSize;
  if (uVar8 == pVVar5->nCap) {
    if ((int)uVar8 < 0x10) {
      if (pVVar5->pArray == (void **)0x0) {
        ppvVar16 = (void **)malloc(0x80);
      }
      else {
        ppvVar16 = (void **)realloc(pVVar5->pArray,0x80);
      }
      pVVar5->pArray = ppvVar16;
      pVVar5->nCap = 0x10;
    }
    else {
      if (pVVar5->pArray == (void **)0x0) {
        ppvVar16 = (void **)malloc((ulong)uVar8 << 4);
      }
      else {
        ppvVar16 = (void **)realloc(pVVar5->pArray,(ulong)uVar8 << 4);
      }
      pVVar5->pArray = ppvVar16;
      pVVar5->nCap = uVar8 * 2;
    }
  }
  else {
    ppvVar16 = pVVar5->pArray;
  }
  iVar7 = pVVar5->nSize;
  pVVar5->nSize = iVar7 + 1;
  ppvVar16[iVar7] = local_440;
  AVar6 = (p->pSat->stats).conflicts;
  iVar7 = clock_gettime(3,local_418);
  if (iVar7 < 0) {
    lVar20 = -1;
  }
  else {
    lVar20 = local_418[0].tv_nsec / 1000 + local_418[0].tv_sec * 1000000;
  }
  pVVar12 = local_440;
  pVVar27 = p;
  iVar7 = Vta_ManAbsPrintFrame
                    (p,local_440,SUB84(local_450,0),(int)AVar6 - local_428,iVar9,lVar20 - lVar28,
                     p->pPars->fVerbose);
  pAig = local_438;
  iVar10 = (int)pVVar12;
  if (iVar7 == 0) {
    iVar7 = local_444 + 1;
    if (local_444 + 1 == 2) {
      piVar13 = &p->pPars->nFramesNoChange;
      *piVar13 = *piVar13 + 1;
      iVar7 = Abc_FrameIsBridgeMode();
      if (iVar7 == 0) {
        local_444 = 2;
        iVar7 = local_444;
      }
      else {
        local_444 = 2;
        if (local_42c != 0) {
          Gia_VtaSendCancel(pVVar27,iVar10);
        }
        pVVar27 = p;
        Gia_VtaSendAbsracted(p,iVar10);
        local_42c = 1;
        iVar7 = local_444;
      }
    }
  }
  else {
    p->pPars->nFramesNoChange = 0;
    local_444 = 1;
    iVar7 = local_444;
  }
  local_444 = iVar7;
  iVar10 = (int)pVVar27;
  if (((ulong)dVar29 & 1) != 0 && p->pPars->fDumpVabs != 0) {
    Abc_FrameSetStatus(-1);
    Abc_FrameSetCex((Abc_Cex_t *)0x0);
    Abc_FrameSetNFrames(SUB84(local_450,0));
    pcVar26 = p->pPars->pFileVabs;
    if (pcVar26 == (char *)0x0) {
      pcVar26 = "vtabs.aig";
    }
    pcVar26 = Extra_FileNameGenericAppend(pcVar26,".status");
    sprintf((char *)local_418,"write_status %s",pcVar26);
    pAbc = Abc_FrameGetGlobalFrame();
    Cmd_CommandExecute(pAbc,(char *)local_418);
    pVVar27 = p;
    Gia_VtaDumpAbsracted(p,pPars->fVerbose);
    iVar10 = (int)pVVar27;
  }
  iVar7 = pAig->vCis->nSize;
  if (((100 - pPars->nRatioMin) * (iVar7 + pAig->nObjs + ~(pAig->vCos->nSize + iVar7))) / 100 <=
      p->nSeenGla) {
    local_454 = -1;
    dVar29 = (double)((ulong)dVar29 & 0xffffffff);
    goto LAB_0062863e;
  }
  pAVar17 = p->pPars;
  local_420 = local_420 + 1;
  dVar29 = local_450;
  if (pAVar17->nFramesMax <= SUB84(local_450,0) && pAVar17->nFramesMax != 0) goto LAB_0062863e;
  goto LAB_00627dc6;
}

Assistant:

int Gia_VtaPerformInt( Gia_Man_t * pAig, Abs_Par_t * pPars )
{
    Vta_Man_t * p;
    Vec_Int_t * vCore;
    Abc_Cex_t * pCex = NULL;
    int i, f, nConfls, Status, nObjOld, RetValue = -1, nCountNoChange = 0, fOneIsSent = 0;
    abctime clk = Abc_Clock(), clk2;
    // preconditions
    assert( Gia_ManPoNum(pAig) == 1 );
    assert( pPars->nFramesMax == 0 || pPars->nFramesStart <= pPars->nFramesMax );
    if ( Gia_ObjIsConst0(Gia_ObjFanin0(Gia_ManPo(pAig,0))) )
    {
        if ( !Gia_ObjFaninC0(Gia_ManPo(pAig,0)) )
        {
            printf( "Sequential miter is trivially UNSAT.\n" );
            return 1;
        } 
        ABC_FREE( pAig->pCexSeq );
        pAig->pCexSeq = Abc_CexMakeTriv( Gia_ManRegNum(pAig), Gia_ManPiNum(pAig), 1, 0 );
        printf( "Sequential miter is trivially SAT.\n" );
        return 0;
    }

    // compute intial abstraction
    if ( pAig->vObjClasses == NULL )
    {
        pAig->vObjClasses = Vec_IntAlloc( 5 );
        Vec_IntPush( pAig->vObjClasses, 1 );
        Vec_IntPush( pAig->vObjClasses, 3 );
        Vec_IntPush( pAig->vObjClasses, 4 );
        Vec_IntPush( pAig->vObjClasses, Gia_ObjFaninId0p(pAig, Gia_ManPo(pAig, 0)) );
    }
    // start the manager
    p = Vga_ManStart( pAig, pPars );
    // set runtime limit
    if ( p->pPars->nTimeOut )
        sat_solver2_set_runtime_limit( p->pSat, p->pPars->nTimeOut * CLOCKS_PER_SEC + Abc_Clock() );
    // perform initial abstraction
    if ( p->pPars->fVerbose )
    {
        Abc_Print( 1, "Running variable-timeframe abstraction (VTA) with the following parameters:\n" );
        Abc_Print( 1, "FramePast = %d  FrameMax = %d  ConfMax = %d  Timeout = %d  RatioMin = %d %%\n", 
            pPars->nFramesPast, pPars->nFramesMax, pPars->nConfLimit, pPars->nTimeOut, pPars->nRatioMin );
        Abc_Print( 1, "LearnStart = %d  LearnDelta = %d  LearnRatio = %d %%.\n", 
            pPars->nLearnedStart, pPars->nLearnedDelta, pPars->nLearnedPerce );
//        Abc_Print( 1, "Frame   %%   Abs   %%   Confl  Cex    SatVar   Core   F0   F1   F2  ...\n" );
        Abc_Print( 1, " Frame   %%   Abs   %%   Confl  Cex   Vars   Clas   Lrns   Core     Time      Mem\n" );
    }
    assert( Vec_PtrSize(p->vFrames) > 0 );
    for ( f = i = 0; !p->pPars->nFramesMax || f < p->pPars->nFramesMax; f++ )
    {
        int nConflsBeg = sat_solver2_nconflicts(p->pSat);
        p->pPars->iFrame = f;
        // realloc storage for abstraction marks
        if ( f == p->nWords * 32 )
            p->nWords = Vec_IntDoubleWidth( p->vSeens, p->nWords );

        // create bookmark to be used for rollback
        nObjOld = p->nObjs;
        sat_solver2_bookmark( p->pSat );
        Vec_IntClear( p->vAddedNew );

        // load new timeframe
        Vga_ManAddClausesOne( p, 0, f );
        if ( f < Vec_PtrSize(p->vFrames) )
            Vga_ManLoadSlice( p, (Vec_Int_t *)Vec_PtrEntry(p->vFrames, f), 0 );
        else
        {
            for ( i = 1; i <= Abc_MinInt(p->pPars->nFramesPast, f); i++ )
                Vga_ManLoadSlice( p, (Vec_Int_t *)Vec_PtrEntry(p->vCores, f-i), i );
        }

        // iterate as long as there are counter-examples
        for ( i = 0; ; i++ )
        { 
            clk2 = Abc_Clock();
            vCore = Vta_ManUnsatCore( Vga_ManGetOutLit(p, f), p->pSat, pPars->nConfLimit, pPars->fVerbose, &Status, &nConfls );
            assert( (vCore != NULL) == (Status == 1) );
            if ( Status == -1 ) // resource limit is reached
            {
                Vga_ManRollBack( p, nObjOld );
                goto finish;
            }
            // check timeout
            if ( p->pSat->nRuntimeLimit && Abc_Clock() > p->pSat->nRuntimeLimit )
            {
                Vga_ManRollBack( p, nObjOld );
                goto finish;
            }
            if ( vCore != NULL )
            {
                p->timeUnsat += Abc_Clock() - clk2;
                break;
            }
            p->timeSat += Abc_Clock() - clk2;
            assert( Status == 0 );
            p->nCexes++;
            // perform the refinement
            clk2 = Abc_Clock();
            pCex = Vta_ManRefineAbstraction( p, f );
            p->timeCex += Abc_Clock() - clk2;
            if ( pCex != NULL )
                goto finish;
            // print the result (do not count it towards change)
            Vta_ManAbsPrintFrame( p, NULL, f+1, sat_solver2_nconflicts(p->pSat)-nConflsBeg, i, Abc_Clock() - clk, p->pPars->fVerbose );
        }
        assert( Status == 1 );
        // valid core is obtained
        Vta_ManUnsatCoreRemap( p, vCore );
        Vec_IntSort( vCore, 1 );
        // update the SAT solver
        sat_solver2_rollback( p->pSat );
        // update storage
        Vga_ManRollBack( p, nObjOld );
        // load this timeframe
        Vga_ManLoadSlice( p, vCore, 0 );
        Vec_IntFree( vCore );

        // run SAT solver
        clk2 = Abc_Clock();
        vCore = Vta_ManUnsatCore( Vga_ManGetOutLit(p, f), p->pSat, pPars->nConfLimit, p->pPars->fVerbose, &Status, &nConfls );
        p->timeUnsat += Abc_Clock() - clk2;
        assert( (vCore != NULL) == (Status == 1) );
        if ( Status == -1 ) // resource limit is reached
            break;
        if ( Status == 0 )
        {
            Vta_ManSatVerify( p );
            // make sure, there was no initial abstraction (otherwise, it was invalid)
            assert( pAig->vObjClasses == NULL && f < p->pPars->nFramesStart );
            pCex = Vga_ManDeriveCex( p );
            break;
        }
        // add the core
        Vta_ManUnsatCoreRemap( p, vCore );
        // add in direct topological order
        Vec_IntSort( vCore, 1 );
        Vec_PtrPush( p->vCores, vCore );
        // print the result
        if ( Vta_ManAbsPrintFrame( p, vCore, f+1, sat_solver2_nconflicts(p->pSat)-nConflsBeg, i, Abc_Clock() - clk, p->pPars->fVerbose ) )
        {
            // reset the counter of frames without change
            nCountNoChange = 1;
            p->pPars->nFramesNoChange = 0;
        }
        else if ( ++nCountNoChange == 2 ) // time to send
        {
            p->pPars->nFramesNoChange++;
            if ( Abc_FrameIsBridgeMode() )
            {
                // cancel old one if it was sent
                if ( fOneIsSent )
                    Gia_VtaSendCancel( p, pPars->fVerbose );
                // send new one 
                Gia_VtaSendAbsracted( p, pPars->fVerbose );
                fOneIsSent = 1;
            }
        }
        // dump the model
        if ( p->pPars->fDumpVabs && (f & 1) )
        {
            char Command[1000];
            Abc_FrameSetStatus( -1 );
            Abc_FrameSetCex( NULL );
            Abc_FrameSetNFrames( f+1 );
            sprintf( Command, "write_status %s", Extra_FileNameGenericAppend((char *)(p->pPars->pFileVabs ? p->pPars->pFileVabs : "vtabs.aig"), ".status") );
            Cmd_CommandExecute( Abc_FrameGetGlobalFrame(), Command );
            Gia_VtaDumpAbsracted( p, pPars->fVerbose );
        }
        // check if the number of objects is below limit
        if ( p->nSeenGla >= Gia_ManCandNum(pAig) * (100-pPars->nRatioMin) / 100 )
        {
            Status = -1;
            break;
        }
    }
finish:
    // analize the results
    if ( pCex == NULL )
    {
        if ( p->pPars->fVerbose && Status == -1 )
            printf( "\n" );
        if ( Vec_PtrSize(p->vCores) == 0 )
            Abc_Print( 1, "Abstraction is not produced because first frame is not solved.  " );
        else
        {
            assert( Vec_PtrSize(p->vCores) > 0 );
//            if ( pAig->vObjClasses != NULL )
//                Abc_Print( 1, "Replacing the old abstraction by a new one.\n" );
            Vec_IntFreeP( &pAig->vObjClasses );
            pAig->vObjClasses = Gia_VtaFramesToAbs( (Vec_Vec_t *)p->vCores );
            if ( Status == -1 )
            {
                if ( p->pPars->nTimeOut && Abc_Clock() >= p->pSat->nRuntimeLimit ) 
                    Abc_Print( 1, "Timeout %d sec in frame %d with a %d-stable abstraction.    ", p->pPars->nTimeOut, f, p->pPars->nFramesNoChange );
                else if ( pPars->nConfLimit && sat_solver2_nconflicts(p->pSat) >= pPars->nConfLimit )
                    Abc_Print( 1, "Exceeded %d conflicts in frame %d with a %d-stable abstraction.  ", pPars->nConfLimit, f, p->pPars->nFramesNoChange );
                else if ( p->nSeenGla >= Gia_ManCandNum(pAig) * (100-pPars->nRatioMin) / 100 )
                    Abc_Print( 1, "The ratio of abstracted objects is less than %d %% in frame %d.  ", pPars->nRatioMin, f );
                else
                    Abc_Print( 1, "Abstraction stopped for unknown reason in frame %d.  ", f );
            }
            else
            {
                p->pPars->iFrame++;
                Abc_Print( 1, "VTA completed %d frames with a %d-stable abstraction.  ", f, p->pPars->nFramesNoChange );
            }
        }
    }
    else
    {
        if ( p->pPars->fVerbose )
            printf( "\n" );
        ABC_FREE( p->pGia->pCexSeq );
        p->pGia->pCexSeq = pCex;
        if ( !Gia_ManVerifyCex( p->pGia, pCex, 0 ) )
            Abc_Print( 1, "    Gia_VtaPerform(): CEX verification has failed!\n" );
        Abc_Print( 1, "Counter-example detected in frame %d.  ", f );
        p->pPars->iFrame = pCex->iFrame - 1;
        Vec_IntFreeP( &pAig->vObjClasses );
        RetValue = 0;
    }
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );

    if ( p->pPars->fVerbose )
    {
        p->timeOther = (Abc_Clock() - clk) - p->timeUnsat - p->timeSat - p->timeCex;
        ABC_PRTP( "Runtime: Solver UNSAT", p->timeUnsat,  Abc_Clock() - clk );
        ABC_PRTP( "Runtime: Solver SAT  ", p->timeSat,    Abc_Clock() - clk );
        ABC_PRTP( "Runtime: Refinement  ", p->timeCex,    Abc_Clock() - clk );
        ABC_PRTP( "Runtime: Other       ", p->timeOther,  Abc_Clock() - clk );
        ABC_PRTP( "Runtime: TOTAL       ", Abc_Clock() - clk, Abc_Clock() - clk );
        Gia_VtaPrintMemory( p );
    }

    Vga_ManStop( p );
    fflush( stdout );
    return RetValue;
}